

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maker.h
# Opt level: O0

void __thiscall
bwt::PasswordMaker::PasswordMaker(PasswordMaker *this,string *configFileName,size_t threadNumber)

{
  logger *in_RDI;
  nullptr_t in_stack_ffffffffffffff08;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_ffffffffffffff10;
  allocator<char> *__a;
  string *pattern;
  string *logger_name;
  allocator<char> local_99;
  string local_98 [39];
  allocator<char> local_71;
  string local_70 [39];
  allocator<char> local_49;
  string local_48 [72];
  
  CLI::std::mutex::mutex((mutex *)0x117401);
  pattern = (string *)&in_RDI->sinks_;
  std::__cxx11::string::string((string *)pattern);
  logger_name = (string *)&in_RDI->custom_err_handler_;
  std::operator+((char *)logger_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  __a = &local_49;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
             (char *)pattern,__a);
  spdlog::stdout_color_mt<spdlog::synchronous_factory>
            (logger_name,(color_mode)((ulong)in_RDI >> 0x20));
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
             (char *)pattern,__a);
  spdlog::stdout_color_mt<spdlog::synchronous_factory>
            (logger_name,(color_mode)((ulong)in_RDI >> 0x20));
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  ThreadPool::ThreadPool((ThreadPool *)in_RDI,(size_t)pattern);
  CLI::std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x11755e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
             (char *)pattern,__a);
  spdlog::logger::set_pattern(in_RDI,pattern,(pattern_time_type)((ulong)__a >> 0x20));
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  return;
}

Assistant:

PasswordMaker(const std::string& configFileName, const std::size_t threadNumber = std::thread::hardware_concurrency()) :
		_configFileName(CONFIG_PATH + configFileName),
		_threadPool(threadNumber) {
		_workerLogger->set_pattern("[%Y-%m-%d %H:%M:%S.%e] [%n] [%^%l%$] [id:%6t] %v");
	}